

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

OptionResult * option_parser_next(OptionResult *__return_storage_ptr__,OptionParser *parser)

{
  char *value_00;
  int iVar1;
  Option *pOVar2;
  size_t __n;
  char *value_2;
  Option *option_1;
  char *value_1;
  char *value;
  size_t long_name_len;
  Option *option;
  size_t i;
  char *arg;
  OptionParser *parser_local;
  
  if (parser->arg_index < parser->argc) {
    iVar1 = parser->arg_index;
    parser->arg_index = iVar1 + 1;
    value_00 = parser->argv[iVar1];
    if (*value_00 == '-') {
      if (value_00[1] == '-') {
        for (option = (Option *)0x0; option < (Option *)parser->num_options;
            option = (Option *)&option->field_0x1) {
          pOVar2 = parser->options + (long)option;
          if (pOVar2->long_name != (char *)0x0) {
            __n = strlen(pOVar2->long_name);
            iVar1 = strncmp(value_00 + 2,pOVar2->long_name,__n);
            if (iVar1 == 0) {
              if (pOVar2->has_value == 0) {
                make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_OPTION,pOVar2,
                                   (char *)0x0);
                return __return_storage_ptr__;
              }
              if (value_00[__n + 2] == '=') {
                make_option_result_with_value
                          (__return_storage_ptr__,OPTION_RESULT_KIND_OPTION,pOVar2,
                           value_00 + __n + 3);
                return __return_storage_ptr__;
              }
              if (parser->argc <= parser->arg_index) {
                make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_EXPECTED_VALUE,pOVar2,
                                   (char *)0x0);
                return __return_storage_ptr__;
              }
              iVar1 = parser->arg_index;
              parser->arg_index = iVar1 + 1;
              make_option_result_with_value
                        (__return_storage_ptr__,OPTION_RESULT_KIND_OPTION,pOVar2,parser->argv[iVar1]
                        );
              return __return_storage_ptr__;
            }
          }
        }
      }
      else {
        for (option = (Option *)0x0; option < (Option *)parser->num_options;
            option = (Option *)&option->field_0x1) {
          pOVar2 = parser->options + (long)option;
          if ((pOVar2->short_name != '\0') && (pOVar2->short_name == value_00[1])) {
            if (value_00[2] != '\0') {
              make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_BAD_SHORT_OPTION,pOVar2,
                                 value_00);
              return __return_storage_ptr__;
            }
            if (pOVar2->has_value != 0) {
              if (parser->argc <= parser->arg_index) {
                make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_EXPECTED_VALUE,pOVar2,
                                   (char *)0x0);
                return __return_storage_ptr__;
              }
              iVar1 = parser->arg_index;
              parser->arg_index = iVar1 + 1;
              make_option_result_with_value
                        (__return_storage_ptr__,OPTION_RESULT_KIND_OPTION,pOVar2,parser->argv[iVar1]
                        );
              return __return_storage_ptr__;
            }
            make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_OPTION,pOVar2,(char *)0x0);
            return __return_storage_ptr__;
          }
        }
      }
      make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_UNKNOWN,(Option *)0x0,value_00);
    }
    else {
      make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_ARG,(Option *)0x0,value_00);
    }
  }
  else {
    make_option_result(__return_storage_ptr__,OPTION_RESULT_KIND_DONE,(Option *)0x0,(char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

OptionResult option_parser_next(OptionParser* parser) {
  if (parser->arg_index >= parser->argc) {
    return make_option_result(OPTION_RESULT_KIND_DONE, NULL, NULL);
  }

  char* arg = parser->argv[parser->arg_index++];
  if (arg[0] == '-') {
    size_t i;
    if (arg[1] == '-') {
      /* Long option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->long_name) {
          continue;
        }

        size_t long_name_len = strlen(option->long_name);
        if (strncmp(&arg[2], option->long_name, long_name_len) == 0) {
          if (option->has_value) {
            if (arg[2 + long_name_len] == '=') {
              char* value = &arg[2 + long_name_len + 1];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_OPTION, option, NULL);
          }
        }
      }
    } else {
      /* Short option. */
      for (i = 0; i < parser->num_options; ++i) {
        const Option* option = &parser->options[i];
        if (!option->short_name) {
          continue;
        }

        if (option->short_name == arg[1]) {
          if (arg[2] == 0) {
            if (option->has_value) {
              if (parser->arg_index >= parser->argc) {
                return make_option_result(OPTION_RESULT_KIND_EXPECTED_VALUE,
                                          option, NULL);
              }

              char* value = parser->argv[parser->arg_index++];
              return make_option_result_with_value(OPTION_RESULT_KIND_OPTION,
                                                   option, value);
            } else {
              return make_option_result(OPTION_RESULT_KIND_OPTION, option,
                                        NULL);
            }
          } else {
            return make_option_result(OPTION_RESULT_KIND_BAD_SHORT_OPTION,
                                      option, arg);
          }
        }
      }
    }

    return make_option_result(OPTION_RESULT_KIND_UNKNOWN, NULL, arg);
  } else {
    /* Argument. */
    return make_option_result(OPTION_RESULT_KIND_ARG, NULL, arg);
  }
}